

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall
delta_complex_t::if_common_create
          (delta_complex_t *this,index_t cl,index_t v,index_t dim,char *filter,size_t thread,
          vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
          *new_cells,
          vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
          *new_cliques,
          vector<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
          *new_clique_cofaces,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  pointer pvVar1;
  long lVar2;
  long *plVar3;
  vector<long,_std::allocator<long>_> *pvVar4;
  pointer pvVar5;
  pointer pdVar6;
  double dVar7;
  int bits;
  iterator iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long *plVar13;
  vector<long,_std::allocator<long>_> *__x;
  ulong uVar14;
  long lVar15;
  index_t v_local;
  int local_220;
  int local_21c;
  vector<int,_std::allocator<int>_> orient;
  vector<long,_std::allocator<long>_> top_row;
  vector<long,_std::allocator<long>_> new_vertices;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  new_orients;
  _Vector_base<long,_std::allocator<long>_> local_180;
  _Vector_base<long,_std::allocator<long>_> local_168;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_150;
  string bin;
  long j;
  _Head_base<1UL,_long,_false> local_110;
  _Head_base<0UL,_long,_false> local_108;
  
  lVar9 = dim + -1;
  lVar12 = *(long *)&(this->cliques).
                     super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar9].
                     super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                     super__Vector_impl_data;
  lVar15 = cl * 0x70;
  if (*(long *)(*(long *)(lVar12 + 0x20 + lVar15) + -8) < v) {
    orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    v_local = v;
    iVar8 = std::
            _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(*(long *)&(((this->cells).
                                   super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                 )._M_impl + v * 0xe8 + 0xb0),*(key_type **)(lVar12 + 0x18 + lVar15)
                  );
    std::vector<int,_std::allocator<int>_>::push_back
              (&orient,(value_type_conflict2 *)
                       ((long)iVar8.super__Node_iterator_base<std::pair<const_long,_int>,_false>.
                              _M_cur + 0x10));
    uVar14 = 1;
    lVar12 = 8;
    while( true ) {
      pvVar1 = (this->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = *(long *)&pvVar1[lVar9].super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                         _M_impl.super__Vector_impl_data;
      lVar2 = *(long *)(lVar10 + 0x18 + lVar15);
      if ((ulong)(*(long *)(lVar10 + 0x20 + lVar15) - lVar2 >> 3) <= uVar14) break;
      iVar8 = std::
              _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(*(long *)&(((this->cells).
                                     super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                   )._M_impl + v_local * 0xe8 + 0xb0),(key_type *)(lVar2 + lVar12));
      if (iVar8.super__Node_iterator_base<std::pair<const_long,_int>,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_00123616;
      std::vector<int,_std::allocator<int>_>::push_back
                (&orient,(value_type_conflict2 *)
                         ((long)iVar8.super__Node_iterator_base<std::pair<const_long,_int>,_false>.
                                _M_cur + 0x10));
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 8;
    }
    new_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    new_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    new_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar12 = *(long *)&pvVar1[lVar9].super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl
                       .super__Vector_impl_data;
    plVar3 = *(long **)(lVar12 + 0x20 + lVar15);
    for (plVar13 = *(long **)(lVar12 + 0x18 + lVar15); plVar13 != plVar3; plVar13 = plVar13 + 1) {
      j = *plVar13;
      std::vector<long,_std::allocator<long>_>::push_back(&new_vertices,&j);
    }
    std::vector<long,_std::allocator<long>_>::push_back(&new_vertices,&v_local);
    pvVar1 = (new_cliques->
             super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar12 = ((long)*(pointer *)
                     ((long)&pvVar1[thread].super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                             _M_impl.super__Vector_impl_data + 8) -
             *(long *)&pvVar1[thread].super__Vector_base<clique_t,_std::allocator<clique_t>_>.
                       _M_impl.super__Vector_impl_data) / 0x70;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_168,&new_vertices);
    clique_t::clique_t((clique_t *)&j,(vector<long,_std::allocator<long>_> *)&local_168,lVar12);
    std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
              (pvVar1 + thread,(clique_t *)&j);
    clique_t::~clique_t((clique_t *)&j);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_168);
    local_110._M_head_impl = v_local;
    j = lVar12;
    local_108._M_head_impl = cl;
    std::vector<std::tuple<long,long,long>,std::allocator<std::tuple<long,long,long>>>::
    emplace_back<std::tuple<long,long,long>>
              ((vector<std::tuple<long,long,long>,std::allocator<std::tuple<long,long,long>>> *)
               ((new_clique_cofaces->
                super__Vector_base<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + thread),(tuple<long,_long,_long> *)&j);
    local_220 = 0;
    for (lVar10 = 0;
        (long)orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2 != lVar10; lVar10 = lVar10 + 1) {
      local_220 = local_220 +
                  (uint)(orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10] == 2);
    }
    iVar11 = 0;
    while( true ) {
      bits = local_220;
      dVar7 = ldexp(1.0,local_220);
      if (dVar7 <= (double)iVar11) break;
      top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      top_row.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_21c = iVar11;
      toBinary_abi_cxx11_(&bin,iVar11,bits);
      iVar11 = 0;
      for (uVar14 = 0;
          uVar14 < (ulong)((long)orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2); uVar14 = uVar14 + 1) {
        j = (long)orient.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14];
        if (j == 2) {
          if (bin._M_dataplus._M_p[iVar11] == '0') {
            j = 0;
            std::vector<long,_std::allocator<long>_>::emplace_back<long>(&top_row,&j);
          }
          else {
            j = 1;
            std::vector<long,_std::allocator<long>_>::emplace_back<long>(&top_row,&j);
          }
          iVar11 = iVar11 + 1;
        }
        else {
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(&top_row,&j);
        }
      }
      lVar10 = *(long *)&(this->cliques).
                         super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar9].
                         super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                         super__Vector_impl_data;
      plVar3 = *(long **)(lVar10 + 8 + lVar15);
      for (plVar13 = *(long **)(lVar10 + lVar15); plVar13 != plVar3; plVar13 = plVar13 + 1) {
        new_orients.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        new_orients.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        new_orients.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar10 = *(long *)&(this->cells).
                           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar9].
                           super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                           ._M_impl;
        pvVar4 = *(vector<long,_std::allocator<long>_> **)(lVar10 + 0x50 + *plVar13 * 0xe8);
        for (__x = *(vector<long,_std::allocator<long>_> **)(lVar10 + 0x48 + *plVar13 * 0xe8);
            __x != pvVar4; __x = __x + 1) {
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)&j,__x);
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&new_orients,(value_type *)&j);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    ((_Vector_base<long,_std::allocator<long>_> *)&j);
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back(&new_orients,&top_row);
        pvVar5 = (new_cells->
                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar6 = *(pointer *)
                  ((long)&pvVar5[thread].
                          super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                          ._M_impl.super__Vector_impl_data + 8);
        lVar10 = *(long *)&pvVar5[thread].
                           super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                           ._M_impl.super__Vector_impl_data;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_180,&new_vertices);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector(&local_150,&new_orients);
        delta_complex_cell_t::delta_complex_cell_t
                  ((delta_complex_cell_t *)&j,(vector<long,_std::allocator<long>_> *)&local_180,
                   &local_150,0.0,((long)pdVar6 - lVar10) / 0xe8,lVar12);
        std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
        emplace_back<delta_complex_cell_t>(pvVar5 + thread,(delta_complex_cell_t *)&j);
        delta_complex_cell_t::~delta_complex_cell_t((delta_complex_cell_t *)&j);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&local_150);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_180);
        delta_complex_cell_t::compute_boundary
                  (*(pointer *)
                    ((long)&(new_cells->
                            super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[thread].
                            super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                            ._M_impl.super__Vector_impl_data + 8) + -1,this,thread,new_cell_cofaces)
        ;
        delta_complex_cell_t::assign_filtration
                  (*(pointer *)
                    ((long)&(new_cells->
                            super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[thread].
                            super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                            ._M_impl.super__Vector_impl_data + 8) + -1,filter,this);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&new_orients);
      }
      std::__cxx11::string::~string((string *)&bin);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&top_row.super__Vector_base<long,_std::allocator<long>_>);
      iVar11 = local_21c + 1;
    }
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&new_vertices.super__Vector_base<long,_std::allocator<long>_>);
LAB_00123616:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&orient.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void if_common_create(index_t cl, index_t v, index_t dim, const char* filter, size_t thread,
        std::vector<std::vector<delta_complex_cell_t>>& new_cells, std::vector<std::vector<clique_t>>& new_cliques,
        std::vector<std::vector<std::tuple<index_t, index_t, index_t>>>& new_clique_cofaces,std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces ){
		//This checks if the vertex v is a neighbour of all vertices in the clique cliques[dim-1][cl]
		//If it is we create a new clique and then compute all the orientations of the edges and create face for each

		//If v is smaller than the largest vertex in the clique we can ignore it,
		//because such a clique would have been constructed earlier
		//as we construct them by adding larger valued vertices at each step
		if(v <= cliques[dim-1][cl].vertices.back()) return;

		//For each vertex u in the clique check if it is a neighbour of v,
		//if it is the record the orientation of the edge(s) between u and v
		std::vector<int> orient;
		orient.push_back(cells[0][v].in_or_out.find(cliques[dim-1][cl].vertices[0])->second);
		for(int i = 1; i < cliques[dim-1][cl].vertices.size(); i++){
			auto it = cells[0][v].in_or_out.find(cliques[dim-1][cl].vertices[i]);
			if(it == cells[0][v].in_or_out.end()) return;
			orient.push_back(it->second);
		}

		//If we reach this point we know that v is a neighbour of all vertices in the clique
		//so we create a new clique by adding v to the previous vertex set
		//Store the cofaces we need to add to old clique, we do this later as need to know index once parrallel threads have combined
		std::vector<index_t> new_vertices;
		for(auto j : cliques[dim-1][cl].vertices) new_vertices.push_back(j);
		new_vertices.push_back(v);
		index_t cli_loc = new_cliques[thread].size();
		new_cliques[thread].push_back(clique_t(new_vertices,cli_loc));
        new_clique_cofaces[thread].push_back(std::make_tuple(cl,v,cli_loc));

		//compute number of bidirectional edges in new clique
		int num_bidirect = 0;
		for(int k = 0; k < orient.size(); k++){
			if(orient[k] == 2) num_bidirect++;
		}

		//take each number between 0 and the number of bidirection edges and represent it in binary_function
		//we use this to create all orientations of the edges
		for(int i = 0; i < pow(2,num_bidirect); i++){
			//create a new orientation matrix by taking the orientation matrix of the old clique_lookup
			//and add an new bottom row, in this new bottom row we orientate any unidirectional edges
			//in there unique way and then use the binary number to decide how the bidirectional  edges are orientated
			std::vector<index_t> top_row;
			std::string bin = toBinary(i,num_bidirect);
			int count = 0;
			for(int j = 0 ; j < orient.size(); j++){
				if(orient[j] == 2){
					if(bin[count] == '0'){ top_row.push_back(0);
					} else{ top_row.push_back(1); }
					count++;
				} else{
					top_row.push_back(orient[j]);
				}
			}
			//Here we add our new bottom row to each of the orientations of original clique
			for(auto f : cliques[dim-1][cl].faces){
				std::vector<std::vector<index_t>> new_orients;
				for(auto t : cells[dim-1][f].orientation) new_orients.push_back(t);
				new_orients.push_back(top_row);
				//We then create a new face with this orientation matrix
				//add out new face the new clique, and compute the boundary of the new face
				index_t loc = new_cells[thread].size();
				new_cells[thread].push_back(delta_complex_cell_t(new_vertices,new_orients,0,loc,cli_loc));
				new_cells[thread].back().compute_boundary(this,thread,new_cell_cofaces);
				new_cells[thread].back().assign_filtration(filter,this);
			}
		}
    }